

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O2

sc_context_t sc_context_create(void *stack_ptr,size_t stack_size,sc_context_proc_t proc)

{
  uint __line;
  void *pvVar1;
  long lVar2;
  sc_context_t psVar3;
  sc_context_sp_t pvVar4;
  ulong uVar5;
  sc_context_t psVar6;
  char *__assertion;
  
  if (stack_ptr == (void *)0x0) {
    __assertion = "stack_ptr != NULL";
    __line = 0x40;
  }
  else if (stack_size < 0x800) {
    __assertion = "stack_size >= SC_MIN_STACK_SIZE";
    __line = 0x41;
  }
  else if (proc == (sc_context_proc_t)0x0) {
    __assertion = "proc != NULL";
    __line = 0x42;
  }
  else {
    uVar5 = stack_size + (long)stack_ptr & 0xfffffffffffffff8;
    psVar6 = (sc_context_t)(uVar5 - 0x20);
    if (stack_ptr < psVar6) {
      pvVar1 = (void *)((ulong)psVar6 & 0xffffffffffffffc0);
      if (pvVar1 < stack_ptr || (long)pvVar1 - (long)stack_ptr == 0) {
        __assertion = "sp_addr > stack_addr";
        __line = 0x50;
      }
      else {
        lVar2 = sc_make_context(pvVar1,(long)pvVar1 - (long)stack_ptr,context_proc);
        if (lVar2 != 0) {
          *(sc_context_proc_t *)(uVar5 - 0x18) = proc;
          psVar3 = sc_current_context();
          *(sc_context_t *)(uVar5 - 0x10) = psVar3;
          *(undefined8 *)(uVar5 - 8) = 0;
          pvVar4 = (sc_context_sp_t)sc_jump_context(lVar2,psVar6);
          psVar6->ctx = pvVar4;
          return psVar6;
        }
        __assertion = "ctx != NULL";
        __line = 0x57;
      }
    }
    else {
      __assertion = "data_addr > stack_addr";
      __line = 0x4b;
    }
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/rhoot[P]sc/src/sc.c",
                __line,"sc_context_t sc_context_create(void *, size_t, sc_context_proc_t)");
}

Assistant:

sc_context_t SC_CALL_DECL sc_context_create (
    void* stack_ptr,
    size_t stack_size,
    sc_context_proc_t proc
) {
    uintptr_t stack_addr;
    uintptr_t sp_addr;
    uintptr_t data_addr;
    sc_context_sp_t ctx;
    context_data* data;

    assert(stack_ptr != NULL);
    assert(stack_size >= SC_MIN_STACK_SIZE);
    assert(proc != NULL);

    /* Determine the bottom of the stack */
    stack_addr = (uintptr_t)stack_ptr;
    sp_addr = stack_addr + stack_size;

    /* Reserve some space at the bottom for the context data */
    data_addr = sp_addr - sizeof(context_data);
    data_addr = align_down(data_addr, ALIGNOF(context_data));
    assert(data_addr > stack_addr);
    sp_addr = data_addr;

    /* Align the stack pointer to a 64-byte boundary */
    sp_addr = align_down(sp_addr, 64);
    assert(sp_addr > stack_addr);

    /* Determine the new stack size */
    stack_size = sp_addr - stack_addr;

    /* Create the context */
    ctx = sc_make_context((void*)sp_addr, stack_size, context_proc);
    assert(ctx != NULL);

    /* Create the context data at the reserved address */
    data = (context_data*)data_addr;
    data->proc = proc;
    data->parent = sc_current_context();
    data->user_data = NULL;

    /* Transfer the proc pointer to the context by briefly switching to it */
    data->ctx = sc_jump_context(ctx, data).ctx;
    return data;
}